

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O1

void __thiscall
duckdb::BuiltinFunctions::AddFunction
          (BuiltinFunctions *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,ScalarFunction *function)

{
  LogicalType *this_00;
  scalar_function_t *this_01;
  pointer pbVar1;
  long lVar2;
  bind_scalar_function_t *pp_Var3;
  bind_scalar_function_t *pp_Var4;
  pointer pbVar5;
  byte bVar6;
  ScalarFunction local_158;
  
  bVar6 = 0;
  pbVar5 = (names->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (names->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    this_00 = &local_158.super_BaseScalarFunction.return_type;
    this_01 = &local_158.function;
    do {
      ::std::__cxx11::string::_M_assign
                ((string *)
                 &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name);
      SimpleFunction::SimpleFunction((SimpleFunction *)&local_158,(SimpleFunction *)function);
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__BaseScalarFunction_02482b00;
      LogicalType::LogicalType(this_00,&(function->super_BaseScalarFunction).return_type);
      local_158.super_BaseScalarFunction.stability = (function->super_BaseScalarFunction).stability;
      local_158.super_BaseScalarFunction.null_handling =
           (function->super_BaseScalarFunction).null_handling;
      local_158.super_BaseScalarFunction.errors = (function->super_BaseScalarFunction).errors;
      local_158.super_BaseScalarFunction.collation_handling =
           (function->super_BaseScalarFunction).collation_handling;
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_02476950;
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      function(this_01,&function->function);
      pp_Var3 = &function->bind;
      pp_Var4 = &local_158.bind;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pp_Var4 = *pp_Var3;
        pp_Var3 = pp_Var3 + (ulong)bVar6 * -2 + 1;
        pp_Var4 = pp_Var4 + (ulong)bVar6 * -2 + 1;
      }
      local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (function->function_info).internal.
           super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (function->function_info).internal.
           super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_158.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_158.function_info.internal.
           super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_158.function_info.internal.
                super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_158.function_info.internal.
           super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_158.function_info.internal.
                super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      AddFunction(this,&local_158);
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_02476950;
      if (local_158.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_158.function.super__Function_base._M_manager)
                  ((_Any_data *)this_01,(_Any_data *)this_01,__destroy_functor);
      }
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__BaseScalarFunction_02482b00;
      LogicalType::~LogicalType(this_00);
      SimpleFunction::~SimpleFunction((SimpleFunction *)&local_158);
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(const vector<string> &names, ScalarFunction function) { // NOLINT: false positive
	for (auto &name : names) {
		function.name = name;
		AddFunction(function);
	}
}